

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error
ft_stroke_border_conicto(PVG_FT_StrokeBorder border,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  PVG_FT_Vector *pPVar1;
  PVG_FT_Byte *pPVar2;
  PVG_FT_Pos PVar3;
  ulong uVar4;
  
  if (-1 < border->start) {
    ft_stroke_border_grow(border,2);
    pPVar1 = border->points;
    uVar4 = (ulong)border->num_points;
    pPVar2 = border->tags;
    PVar3 = control->y;
    pPVar1[uVar4].x = control->x;
    pPVar1[uVar4].y = PVar3;
    PVar3 = to->y;
    pPVar1[uVar4 + 1].x = to->x;
    pPVar1[uVar4 + 1].y = PVar3;
    (pPVar2 + uVar4)[0] = '\0';
    (pPVar2 + uVar4)[1] = '\x01';
    border->num_points = border->num_points + 2;
    border->movable = '\0';
    return (PVG_FT_Error)pPVar1;
  }
  __assert_fail("border->start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                ,0x16a,
                "PVG_FT_Error ft_stroke_border_conicto(PVG_FT_StrokeBorder, PVG_FT_Vector *, PVG_FT_Vector *)"
               );
}

Assistant:

static PVG_FT_Error ft_stroke_border_conicto(PVG_FT_StrokeBorder border,
                                            PVG_FT_Vector*      control,
                                            PVG_FT_Vector*      to)
{
    PVG_FT_Error error;

    assert(border->start >= 0);

    error = ft_stroke_border_grow(border, 2);
    if (!error) {
        PVG_FT_Vector* vec = border->points + border->num_points;
        PVG_FT_Byte*   tag = border->tags + border->num_points;

        vec[0] = *control;
        vec[1] = *to;

        tag[0] = 0;
        tag[1] = PVG_FT_STROKE_TAG_ON;

        border->num_points += 2;
    }

    border->movable = FALSE;

    return error;
}